

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O2

void re2c::keygen<unsigned_int>(FILE *f,size_t count,size_t len,size_t len_match,rule_rank_t match)

{
  ulong __n;
  uint n;
  uint uVar1;
  void *__ptr;
  uint uVar2;
  
  n = Skeleton::rule2key<unsigned_int>(match);
  __n = count * 3;
  __ptr = operator_new__(-(ulong)(__n >> 0x3e != 0) | count * 0xc);
  for (uVar2 = 2; uVar2 - 2 < __n; uVar2 = uVar2 + 3) {
    uVar1 = to_le<unsigned_int>((uint)len);
    *(uint *)((long)__ptr + (ulong)(uVar2 - 2) * 4) = uVar1;
    uVar1 = to_le<unsigned_int>((uint)len_match);
    *(uint *)((long)__ptr + (ulong)(uVar2 - 1) * 4) = uVar1;
    uVar1 = to_le<unsigned_int>(n);
    *(uint *)((long)__ptr + (ulong)uVar2 * 4) = uVar1;
  }
  fwrite(__ptr,4,__n,(FILE *)f);
  operator_delete__(__ptr);
  return;
}

Assistant:

static void keygen (FILE * f, size_t count, size_t len, size_t len_match, rule_rank_t match)
{
	const key_t m = Skeleton::rule2key<key_t> (match);

	const size_t keys_size = 3 * count;
	key_t * keys = new key_t [keys_size];
	for (uint32_t i = 0; i < keys_size;)
	{
		keys[i++] = to_le<key_t>(static_cast<key_t> (len));
		keys[i++] = to_le<key_t>(static_cast<key_t> (len_match));
		keys[i++] = to_le<key_t>(m);
	}
	fwrite (keys, sizeof (key_t), keys_size, f);
	delete [] keys;
}